

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YamlParser.h
# Opt level: O2

void __thiscall yaml::Value::Value(Value *this,string *s)

{
  _Rb_tree_header *p_Var1;
  
  this->type_ = String;
  std::__cxx11::string::string((string *)&this->string_,(string *)s);
  p_Var1 = &(this->mapping_).map_._M_t._M_impl.super__Rb_tree_header;
  (this->mapping_).map_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->mapping_).map_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->mapping_).map_._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->mapping_).map_._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->mapping_).map_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->sequence_).super__Vector_base<yaml::Value,_std::allocator<yaml::Value>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->sequence_).super__Vector_base<yaml::Value,_std::allocator<yaml::Value>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->sequence_).super__Vector_base<yaml::Value,_std::allocator<yaml::Value>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

Value(std::string &&s) : type_(Type::String), string_(std::move(s)) {}